

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O1

void __thiscall
FIX::double_conversion::Single::NormalizedBoundaries
          (Single *this,DiyFp *out_m_minus,DiyFp *out_m_plus)

{
  uint64_t uVar1;
  int iVar2;
  long lVar3;
  DiyFp DVar4;
  DiyFp local_40;
  
  if (0.0 < (float)this->d32_) {
    DVar4 = AsDiyFp(this);
    uVar1 = DVar4.f_;
    lVar3 = uVar1 * 2;
    local_40.f_ = uVar1 * 2 + 1;
    iVar2 = DVar4.e_ + -1;
    local_40.e_ = iVar2;
    DiyFp::Normalize(&local_40);
    if (((this->d32_ & 0x7fffff) == 0) && ((this->d32_ & 0x7f000000) != 0)) {
      lVar3 = uVar1 << 2;
      iVar2 = DVar4.e_ + -2;
    }
    out_m_plus->f_ = local_40.f_;
    out_m_plus->e_ = local_40.e_;
    out_m_minus->f_ = lVar3 + -1 << ((char)iVar2 - (char)local_40.e_ & 0x3fU);
    out_m_minus->e_ = local_40.e_;
    return;
  }
  __assert_fail("value() > 0.0",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/ieee.h"
                ,0x157,
                "void FIX::double_conversion::Single::NormalizedBoundaries(DiyFp *, DiyFp *) const")
  ;
}

Assistant:

void NormalizedBoundaries(DiyFp* out_m_minus, DiyFp* out_m_plus) const {
    ASSERT(value() > 0.0);
    DiyFp v = this->AsDiyFp();
    DiyFp m_plus = DiyFp::Normalize(DiyFp((v.f() << 1) + 1, v.e() - 1));
    DiyFp m_minus;
    if (LowerBoundaryIsCloser()) {
      m_minus = DiyFp((v.f() << 2) - 1, v.e() - 2);
    } else {
      m_minus = DiyFp((v.f() << 1) - 1, v.e() - 1);
    }
    m_minus.set_f(m_minus.f() << (m_minus.e() - m_plus.e()));
    m_minus.set_e(m_plus.e());
    *out_m_plus = m_plus;
    *out_m_minus = m_minus;
  }